

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_wstring.cpp
# Opt level: O1

bool __thiscall ON_wString::TruncateMid(ON_wString *this,int pos)

{
  int iVar1;
  bool bVar2;
  ON_Internal_Empty_wString *pOVar3;
  int iVar4;
  
  if (0 < pos) {
    pOVar3 = (ON_Internal_Empty_wString *)(this->m_s + -3);
    if (this->m_s == (wchar_t *)0x0) {
      pOVar3 = &empty_wstring;
    }
    iVar1 = (pOVar3->header).string_length;
    iVar4 = iVar1 - pos;
    if (pOVar3 == &empty_wstring || iVar1 < pos) {
      bVar2 = false;
    }
    else {
      CopyArray(this);
      memmove(this->m_s,this->m_s + (uint)pos,(long)iVar4 * 4 + 4);
      pOVar3 = (ON_Internal_Empty_wString *)(this->m_s + -3);
      if (this->m_s == (wchar_t *)0x0) {
        pOVar3 = &empty_wstring;
      }
      (pOVar3->header).string_length = iVar4;
      bVar2 = true;
    }
    return bVar2;
  }
  return false;
}

Assistant:

bool ON_wString::TruncateMid(int pos)
{
  if (pos <= 0)
    return false;

  const auto length = Header()->string_length;
  if (pos > length)
    return false;

  if (Header() == pEmptyStringHeader)
    return false; // Should never happen.

  CopyArray();
  const auto newLength = size_t(length - pos);
  memmove(m_s, m_s + pos, (newLength + 1) * sizeof(wchar_t));
  Header()->string_length = int(newLength);

  return true;
}